

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::ProjectionLight::PDF_Le(ProjectionLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  bool bVar2;
  float *in_RCX;
  undefined4 *in_RDX;
  Point2f *in_RDI;
  Float FVar3;
  float fVar4;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3<float> VVar10;
  Point3<float> PVar11;
  Vector3<float> *in_stack_00000048;
  Transform *in_stack_00000050;
  Point3f ps;
  Vector3f w;
  Point3<float> *in_stack_000000e8;
  Transform *in_stack_000000f0;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  Point3<float> *in_stack_ffffffffffffff40;
  Bounds2<float> *this_00;
  Vector3<float> *in_stack_ffffffffffffff60;
  PiecewiseConstant2D *in_stack_ffffffffffffff70;
  Point2<float> local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_64;
  float local_5c;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  undefined8 local_2c;
  float local_24;
  float *local_20;
  
  auVar9 = in_ZMM0._8_56_;
  *in_RDX = 0;
  local_20 = in_RCX;
  VVar10 = Transform::ApplyInverse<float>(in_stack_00000050,in_stack_00000048);
  local_40 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar9;
  local_48 = vmovlpd_avx(auVar6._0_16_);
  local_38 = local_48;
  local_30 = local_40;
  VVar10 = Normalize<float>(in_stack_ffffffffffffff60);
  local_50 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_58 = vmovlpd_avx(auVar7._0_16_);
  auVar9 = (undefined1  [56])0x0;
  if (in_RDI[0x39].super_Tuple2<pbrt::Point2,_float>.y <= local_50) {
    local_2c = local_58;
    local_24 = local_50;
    Point3<float>::Point3<float>
              (in_stack_ffffffffffffff40,
               (Vector3<float> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    PVar11 = Transform::operator()(in_stack_000000f0,in_stack_000000e8);
    local_78 = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    local_80 = vmovlpd_avx(auVar8._0_16_);
    local_64 = local_80;
    local_5c = local_78;
    Point2<float>::Point2
              ((Point2<float> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               in_stack_ffffffffffffff38);
    bVar2 = Inside<float>(&local_88,
                          (Bounds2<float> *)&in_RDI[0x37].super_Tuple2<pbrt::Point2,_float>.y);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_00 = (Bounds2<float> *)(in_RDI + 0x5b);
      Point2<float>::Point2
                ((Point2<float> *)this_00,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      FVar3 = PiecewiseConstant2D::PDF(in_stack_ffffffffffffff70,in_RDI);
      fVar4 = Bounds2<float>::Area(this_00);
      fVar1 = in_RDI[0x5a].super_Tuple2<pbrt::Point2,_float>.x;
      fVar5 = Pow<3>((float)((ulong)this_00 >> 0x20));
      *local_20 = (FVar3 * fVar4) / (fVar1 * fVar5);
    }
    else {
      *local_20 = 0.0;
    }
  }
  else {
    *local_20 = 0.0;
  }
  return;
}

Assistant:

void ProjectionLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;

    Vector3f w = Normalize(renderFromLight.ApplyInverse(ray.d));
    if (w.z < hither) {
        *pdfDir = 0;
        return;
    }
    Point3f ps = ScreenFromLight(Point3f(w));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds)) {
        *pdfDir = 0;
        return;
    }
    *pdfDir = distrib.PDF(Point2f(ps.x, ps.y)) * screenBounds.Area() / (A * Pow<3>(w.z));
}